

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_float4 *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  char *pcVar1;
  size_type *psVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  size_type sVar5;
  ulong uVar6;
  bool bVar7;
  undefined1 uVar8;
  char cVar9;
  int iVar10;
  uint32_t uVar11;
  ostream *poVar12;
  undefined8 *puVar13;
  const_iterator cVar14;
  long *plVar15;
  long *plVar16;
  mapped_type *pmVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  _Base_ptr p_Var19;
  Property *args;
  size_type __n;
  ulong __n_00;
  _Base_ptr p_Var20;
  string *__v;
  size_t i;
  ulong uVar21;
  long lVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  ParseResult ret;
  string attr_type_name;
  ostringstream ss_e_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  optional<std::array<float,_4UL>_> pv;
  stringstream ss;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *target;
  string local_600;
  undefined1 local_5e0 [8];
  _Alloc_hider local_5d8;
  undefined1 local_5d0 [24];
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [32];
  Property *local_588;
  key_type local_580;
  UsdPrimvarReader_float4 *local_560;
  AttrMetas *local_558;
  AttrMetas *local_550;
  Property *local_548;
  string *local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  undefined1 local_518 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_510;
  undefined1 local_508 [16];
  Variability VStack_4f8;
  undefined4 uStack_4f4;
  undefined1 uStack_4f0;
  undefined7 uStack_4ef;
  undefined1 uStack_4e8;
  ios_base local_4a8 [280];
  optional<tinyusdz::Animatable<std::array<float,4ul>>> *local_390;
  undefined1 local_388 [32];
  ulong local_368;
  undefined1 local_360 [16];
  undefined1 local_350 [52];
  optional<std::array<float,_4UL>_> local_31c;
  optional<std::array<float,_4UL>_> local_308;
  string local_2f0 [16];
  long local_2e0 [2];
  string local_2d0;
  undefined1 local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2a0;
  undefined8 local_290;
  _Alloc_hider _Stack_288;
  pointer local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_278;
  storage_union sStack_268;
  vtable_type *local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_250;
  _Alloc_hider _Stack_240;
  pointer local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_230;
  _Alloc_hider local_220;
  undefined1 local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  _Alloc_hider local_200;
  size_type sStack_1f8;
  undefined1 local_1f0 [48];
  _Alloc_hider local_1c0;
  undefined1 auStack_1b8 [48];
  pointer local_188;
  storage_t<double> sStack_180;
  optional<tinyusdz::Token> local_178;
  undefined1 local_150 [48];
  undefined1 auStack_120 [40];
  undefined1 auStack_f8 [56];
  undefined1 auStack_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [80];
  
  local_350._24_8_ = local_350 + 8;
  local_350._8_4_ = 0;
  local_350._16_8_ = (_Link_type)0x0;
  local_350._40_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  target = (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)err;
  local_540 = warn;
  local_350._32_8_ = local_350._24_8_;
  local_2b0._0_8_ = &aStack_2a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)local_350,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != &aStack_2a0) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(aStack_2a0._M_allocated_capacity + 1));
  }
  p_Var19 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_388._16_8_ = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  bVar7 = true;
  if (p_Var19 != (_Base_ptr)local_388._16_8_) {
    local_558 = &(preader->fallback)._metas;
    local_388._8_8_ = &(preader->fallback)._paths;
    local_390 = (optional<tinyusdz::Animatable<std::array<float,4ul>>> *)
                &(preader->fallback)._attrib;
    local_548 = (Property *)&preader->varname;
    local_550 = &(preader->result)._metas;
    local_4a8._272_8_ = &(preader->result)._actual_type_name;
    local_388._0_8_ = &(preader->super_ShaderNode).super_UsdShadePrim.props;
    local_560 = preader;
    do {
      local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_538,*(long *)(p_Var19 + 1),
                 (long)&(p_Var19[1]._M_parent)->_M_color + *(long *)(p_Var19 + 1));
      local_588 = (Property *)(p_Var19 + 2);
      local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"inputs:fallback","");
      sVar5 = local_538._M_string_length;
      sVar4 = local_600._M_string_length;
      local_5d8._M_p = local_5d0 + 8;
      local_5d0._0_8_ = (char *)0x0;
      local_5d0._8_8_ = local_5d0._8_8_ & 0xffffffffffffff00;
      __n = local_538._M_string_length;
      if (local_600._M_string_length < local_538._M_string_length) {
        __n = local_600._M_string_length;
      }
      if (__n == 0) {
        if (local_538._M_string_length == local_600._M_string_length) goto LAB_0023aaad;
LAB_0023adf6:
        local_5e0._0_4_ = 1;
      }
      else {
        iVar10 = bcmp(local_538._M_dataplus._M_p,local_600._M_dataplus._M_p,__n);
        if ((sVar5 != sVar4) || (iVar10 != 0)) goto LAB_0023adf6;
LAB_0023aaad:
        if (((ulong)p_Var19[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          local_5e0._0_4_ = 7;
          local_5b8._0_8_ = &DAT_0000003e;
          local_518 = (undefined1  [8])local_508;
          local_518 = (undefined1  [8])
                      ::std::__cxx11::string::_M_create((ulong *)local_518,(ulong)local_5b8);
          local_508._0_8_ = local_5b8._0_8_;
          builtin_strncpy((char *)local_518,
                          "Property `{}` must be Attribute, but declared as Relationship.",0x3e);
          pbStack_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_5b8._0_8_;
          *(char *)((long)local_518 + local_5b8._0_8_) = '\0';
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)local_518,&local_600,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_5b8._0_8_);
          ::std::__cxx11::string::operator=((string *)&local_5d8,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &aStack_2a0) {
            operator_delete((void *)local_2b0._0_8_,(ulong)(aStack_2a0._M_allocated_capacity + 1));
          }
          if (local_518 != (undefined1  [8])local_508) {
            operator_delete((void *)local_518,(ulong)(local_508._0_8_ + 1));
          }
        }
        if (p_Var19[6]._M_left != p_Var19[6]._M_parent) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_388._8_8_,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var19[6]._M_parent);
          local_5e0 = (undefined1  [8])((ulong)local_5e0 & 0xffffffff00000000);
        }
        Attribute::type_name_abi_cxx11_((string *)local_5b8,&local_588->_attrib);
        local_2b0._0_8_ = &aStack_2a0;
        local_2b0._8_8_ = (_Base_ptr)0x6;
        aStack_2a0._M_allocated_capacity._0_7_ = 0x3474616f6c66;
        if ((pointer)local_5b8._8_8_ == (pointer)0x6) {
          if ((short)*(int *)(local_5b8._0_8_ + 4) != 0x3474 ||
              *(int *)local_5b8._0_8_ != 0x616f6c66) {
            pbStack_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6;
            local_508._0_7_ = 0x3474616f6c66;
            local_518 = (undefined1  [8])local_508;
            if ((short)*(int *)(local_5b8._0_8_ + 4) != 0x3474 ||
                *(int *)local_5b8._0_8_ != 0x616f6c66) goto LAB_0023ac88;
          }
          iVar10 = *(int *)((long)&p_Var19[0x17]._M_parent + 4);
          if (iVar10 == 1) {
            if (p_Var19[5]._M_left == p_Var19[5]._M_parent) {
              if (p_Var19[4]._M_right == (_Base_ptr)0x0) {
                bVar7 = false;
              }
              else {
                iVar10 = (**(code **)p_Var19[4]._M_right)();
                bVar7 = iVar10 == 4;
              }
              uVar8 = (undefined1)p_Var19[5]._M_color;
              if ((bVar7) || ((uVar8 & _S_black) != _S_red)) {
                (local_560->fallback)._blocked = true;
              }
            }
            else {
              uVar8 = (undefined1)p_Var19[5]._M_color;
            }
            if (((((uVar8 & _S_black) == _S_red) && (p_Var19[4]._M_right != (_Base_ptr)0x0)) &&
                ((iVar10 = (**(code **)p_Var19[4]._M_right)(), iVar10 == 0 ||
                 ((p_Var19[4]._M_right != (_Base_ptr)0x0 &&
                  (iVar10 = (**(code **)p_Var19[4]._M_right)(), iVar10 == 1)))))) &&
               (p_Var19[5]._M_left == p_Var19[5]._M_parent)) {
              if (p_Var19[6]._M_left == p_Var19[6]._M_parent) goto LAB_0023adcf;
              AttrMetas::operator=(local_558,(AttrMetas *)(p_Var19 + 7));
              __v = (string *)&local_538;
              goto LAB_0023b03c;
            }
            uStack_4f0 = 0;
            uStack_4ef = 0;
            uStack_4e8 = 0;
            local_508._8_8_ = (void *)0x0;
            VStack_4f8 = Varying;
            uStack_4f4._0_1_ = false;
            uStack_4f4._1_3_ = 0;
            local_518 = (undefined1  [8])0x0;
            pbStack_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_508._0_8_ = local_508._0_8_ & 0xffffffffffff0000;
            bVar7 = primvar::PrimVar::is_valid((PrimVar *)&p_Var19[4]._M_parent);
            if (bVar7) {
              if ((((char)p_Var19[5]._M_color == _S_red) && (p_Var19[4]._M_right != (_Base_ptr)0x0))
                 && ((iVar10 = (**(code **)p_Var19[4]._M_right)(), iVar10 == 0 ||
                     ((p_Var19[4]._M_right != (_Base_ptr)0x0 &&
                      (iVar10 = (**(code **)p_Var19[4]._M_right)(), iVar10 == 1)))))) {
                cVar9 = '\0';
              }
              else {
                primvar::PrimVar::get_value<std::array<float,4ul>>
                          (&local_31c,(PrimVar *)&p_Var19[4]._M_parent);
                cVar9 = local_31c.has_value_;
                if (local_31c.has_value_ != false) {
                  local_308._3_1_ = SUB81(local_31c.contained._0_8_,0);
                  local_308.contained._0_7_ = (undefined7)((ulong)local_31c.contained._0_8_ >> 8);
                  local_308.contained._7_1_ = (undefined1)local_31c.contained._8_8_;
                  local_308.contained._8_7_ = (undefined7)((ulong)local_31c.contained._8_8_ >> 8);
                  local_518 = (undefined1  [8])local_31c.contained._0_8_;
                  pbStack_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_31c.contained._8_8_;
                  local_508._0_2_ = 1;
                }
              }
              p_Var20 = p_Var19[5]._M_parent;
              if (p_Var19[5]._M_left == p_Var20) {
                if (cVar9 == '\0') goto LAB_0023c307;
                uVar23 = 0;
                uVar24 = 0;
                _Stack_288._M_p._0_4_ = Varying;
                uVar25._0_1_ = false;
                uVar25._1_3_ = 0;
                uVar8 = 0;
                local_280 = (pointer)0x0;
              }
              else {
                lVar22 = 0;
                uVar21 = 0;
                do {
                  if ((char)p_Var19[6]._M_color == _S_black) {
                    tinyusdz::value::TimeSamples::update((TimeSamples *)&p_Var19[5]._M_parent);
                    p_Var20 = p_Var19[5]._M_parent;
                  }
                  if (*(char *)((long)&p_Var20[1]._M_color + lVar22) == '\x01') {
                    TypedTimeSamples<std::array<float,_4UL>_>::add_blocked_sample
                              ((TypedTimeSamples<std::array<float,_4UL>_> *)(local_508 + 8),
                               *(double *)((long)&p_Var20->_M_color + lVar22));
                  }
                  else {
                    tinyusdz::value::Value::get_value<std::array<float,4ul>>
                              (&local_308,(Value *)((long)&p_Var20->_M_parent + lVar22),false);
                    local_31c.has_value_ = local_308.has_value_;
                    if (local_308.has_value_ != true) {
                      if ((void *)local_508._8_8_ != (void *)0x0) {
                        operator_delete((void *)local_508._8_8_,
                                        CONCAT71(uStack_4ef,uStack_4f0) - local_508._8_8_);
                      }
                      goto LAB_0023c307;
                    }
                    local_31c.contained._0_8_ =
                         CONCAT17(local_308.contained._7_1_,local_308.contained._0_7_);
                    local_31c.contained._8_8_ =
                         CONCAT17(local_308.contained._15_1_,local_308.contained._8_7_);
                    TypedTimeSamples<std::array<float,_4UL>_>::add_sample
                              ((TypedTimeSamples<std::array<float,_4UL>_> *)(local_508 + 8),
                               *(double *)((long)&p_Var20->_M_color + lVar22),
                               (array<float,_4UL> *)&local_31c.contained);
                  }
                  uVar21 = uVar21 + 1;
                  p_Var20 = p_Var19[5]._M_parent;
                  lVar22 = lVar22 + 0x28;
                } while (uVar21 < (ulong)(((long)p_Var19[5]._M_left - (long)p_Var20 >> 3) *
                                         -0x3333333333333333));
                local_280 = (pointer)CONCAT71(uStack_4ef,uStack_4f0);
                uVar23 = local_508._8_4_;
                uVar24 = local_508._12_4_;
                _Stack_288._M_p._0_4_ = VStack_4f8;
                uVar25 = uStack_4f4;
                uVar8 = uStack_4e8;
              }
              local_580.field_2._M_local_buf[7] = (char)local_508._0_8_;
              local_580.field_2._M_local_buf[8] = SUB81(local_508._0_8_,1);
              local_580._M_dataplus._M_p._7_1_ = local_518[0];
              local_580._M_string_length._0_7_ = local_518._1_7_;
              local_580._M_string_length._7_1_ = SUB81(pbStack_510,0);
              local_580.field_2._M_allocated_capacity._0_7_ = (undefined7)((ulong)pbStack_510 >> 8);
              local_2b0[0] = 1;
              aStack_2a0._8_2_ = local_508._0_2_;
              local_2b0._8_8_ = local_518;
              aStack_2a0._M_allocated_capacity = (size_type)pbStack_510;
              local_290 = (void *)CONCAT44(uVar24,uVar23);
              _Stack_288._M_p._4_1_ = SUB41(uVar25,0);
              _Stack_288._M_p._5_3_ = SUB43(uVar25,1);
              aStack_278._M_local_buf[0] = uVar8;
              nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,4ul>>>::
              operator=(local_390,(Animatable<std::array<float,_4UL>_> *)(local_2b0 + 8));
              if (((local_2b0._0_8_ & 1) != 0) && (local_290 != (void *)0x0)) {
                operator_delete(local_290,(long)local_280 - (long)local_290);
              }
              goto LAB_0023b01b;
            }
LAB_0023c307:
            local_5e0._0_4_ = 8;
            warn = (string *)0x55;
            ::std::__cxx11::string::_M_replace((ulong)&local_5d8,0,(char *)local_5d0._0_8_,0x5d423e)
            ;
          }
          else if (iVar10 == 0) {
            (local_560->fallback)._value_empty = true;
LAB_0023b01b:
            AttrMetas::operator=(local_558,(AttrMetas *)(p_Var19 + 7));
            __v = &local_600;
LAB_0023b03c:
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_350,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
            local_5e0 = (undefined1  [8])((ulong)local_5e0 & 0xffffffff00000000);
          }
          else {
            warn = (string *)0x25;
            ::std::__cxx11::string::_M_replace((ulong)&local_5d8,0,(char *)local_5d0._0_8_,0x5d3f70)
            ;
            local_5e0._0_4_ = 8;
          }
        }
        else {
LAB_0023ac88:
          local_5e0._0_4_ = 3;
          ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)aStack_2a0._M_local_buf,"Property type mismatch. ",0x18);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)aStack_2a0._M_local_buf,local_600._M_dataplus._M_p,
                               local_600._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," expects type `",0xf);
          pbStack_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6;
          local_508._0_7_ = 0x3474616f6c66;
          local_518 = (undefined1  [8])local_508;
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_508,6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"` but defined as type `",0x17);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(char *)local_5b8._0_8_,local_5b8._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"`",1);
          if (local_518 != (undefined1  [8])local_508) {
            operator_delete((void *)local_518,(ulong)(local_508._0_8_ + 1));
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)&local_5d8,(string *)local_518);
          if (local_518 != (undefined1  [8])local_508) {
            operator_delete((void *)local_518,(ulong)(local_508._0_8_ + 1));
          }
          ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)aStack_230._M_local_buf);
        }
LAB_0023adcf:
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8) {
          operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_600._M_dataplus._M_p != &local_600.field_2) {
        operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p != &local_538.field_2) {
        operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
      }
      iVar10 = 0;
      if (((ulong)local_5e0 & 0xfffffffd) == 0) {
        iVar10 = 3;
LAB_0023b0d7:
        bVar7 = false;
      }
      else {
        bVar7 = true;
        if (local_5e0._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x10f2);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          local_5b8._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5b8,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)local_518,(fmt *)local_5b8,(string *)"inputs:fallback",
                     (char (*) [16])&local_5d8,warn);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,(char *)local_518,(long)pbStack_510);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          if (local_518 != (undefined1  [8])local_508) {
            operator_delete((void *)local_518,(ulong)(local_508._0_8_ + 1));
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8) {
            operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
          }
          if (target != (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar13 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                (local_5b8,(ulong)(target->_metas).interpolation);
            pcVar1 = (char *)(puVar13 + 2);
            if ((char *)*puVar13 == pcVar1) {
              local_508._0_8_ = *(undefined8 *)pcVar1;
              local_508._8_8_ = puVar13[3];
              local_518 = (undefined1  [8])local_508;
            }
            else {
              local_508._0_8_ = *(undefined8 *)pcVar1;
              local_518 = (undefined1  [8])*puVar13;
            }
            pbStack_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          puVar13[1];
            *puVar13 = pcVar1;
            puVar13[1] = 0;
            *(undefined1 *)(puVar13 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)target,(string *)local_518);
            if (local_518 != (undefined1  [8])local_508) {
              operator_delete((void *)local_518,(ulong)(local_508._0_8_ + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8) {
              operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)&_Stack_240);
          iVar10 = 1;
          goto LAB_0023b0d7;
        }
      }
      if (local_5d8._M_p != local_5d0 + 8) {
        operator_delete(local_5d8._M_p,local_5d0._8_8_ + 1);
      }
      if (bVar7) {
        p_Var20 = p_Var19 + 1;
        iVar10 = ::std::__cxx11::string::compare((char *)p_Var20);
        if (iVar10 == 0) {
          local_2b0._0_8_ = &aStack_2a0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"inputs:varname","")
          ;
          cVar14 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_350,(key_type *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &aStack_2a0) {
            operator_delete((void *)local_2b0._0_8_,(ulong)(aStack_2a0._M_allocated_capacity + 1));
          }
          if (cVar14._M_node == (_Base_ptr)(local_350 + 8)) {
            local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
            local_2b0._8_8_ = ((ulong)local_2b0._8_8_ >> 8 & 0xffffff) << 8;
            aStack_2a0._M_allocated_capacity = aStack_2a0._M_allocated_capacity & 0xffffffffffff0000
            ;
            aStack_2a0._8_2_ = aStack_2a0._8_2_ & 0xff00;
            local_220._M_p = (pointer)0x0;
            local_218 = 0;
            auStack_120._32_8_ = 0;
            auStack_f8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_120._16_8_ = 0;
            auStack_120._24_8_ = 0;
            auStack_f8._16_4_ = 0;
            auStack_f8._24_8_ = 0;
            sStack_268._8_1_ = 0;
            aStack_278._8_8_ = 0;
            sStack_268.dynamic = (void *)0x0;
            local_280 = (pointer)0x0;
            aStack_278._M_allocated_capacity = 0;
            local_290 = (void *)0x0;
            _Stack_288._M_p = (pointer)0x0;
            aStack_230._M_local_buf[8] = '\0';
            local_238 = (pointer)0x0;
            aStack_230._M_allocated_capacity = 0;
            aStack_250._8_8_ = (pointer)0x0;
            _Stack_240._M_p = (pointer)0x0;
            local_258 = (vtable_type *)0x0;
            aStack_250._M_allocated_capacity = 0;
            local_1f0[0] = 0;
            local_200._M_p = (pointer)0x0;
            sStack_1f8 = 0;
            local_210._M_local_buf[0] = false;
            local_210._M_allocated_capacity._1_3_ = 0;
            local_210._M_allocated_capacity._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
            local_210._M_local_buf[8] = false;
            local_210._9_3_ = 0;
            local_210._12_4_ = (storage_t<unsigned_int>)0x0;
            local_1f0[0x28] = '\0';
            local_1f0._24_8_ = 0;
            local_1f0._32_8_ = 0;
            local_1f0._8_8_ = 0;
            local_1f0._16_8_ = 0;
            auStack_1b8[0x18] = 0;
            auStack_1b8._8_8_ = 0;
            auStack_1b8._16_8_ = 0;
            local_1c0._M_p = (pointer)0x0;
            auStack_1b8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_178.contained._8_1_ = 0;
            local_178.has_value_ = false;
            local_178._1_7_ = 0;
            local_178.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_188 = (pointer)0x0;
            sStack_180 = (storage_t<double>)0x0;
            auStack_1b8._32_8_ = 0;
            auStack_1b8._40_8_ = 0;
            local_150[0x10] = 0;
            local_150._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_150._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_178.contained._16_8_ = 0;
            local_178.contained._24_8_ = 0;
            auStack_120[8] = 0;
            local_150._40_8_ = 0;
            auStack_120._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_150._24_8_ = 0;
            local_150._32_8_ = 0;
            auStack_f8._32_8_ = (long)auStack_f8 + 0x10;
            auStack_c0[0x18] = 0;
            auStack_c0._8_8_ = 0;
            auStack_c0._16_8_ = 0;
            auStack_f8._48_8_ = 0;
            auStack_c0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_a0[0x10] = 0;
            local_a0._17_8_ = 0;
            local_a0._0_8_ = 0;
            local_a0[8] = 0;
            local_a0._9_7_ = 0;
            local_80[0x40] = 0;
            local_80._65_8_ = 0;
            local_80._48_8_ = 0;
            local_80[0x38] = _S_red;
            local_80._57_7_ = 0;
            local_80._32_8_ = 0;
            local_80._40_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_80._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_80._24_8_ = 0;
            local_80._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_80._8_8_ = 0;
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            local_5a8._24_8_ = p_Var20;
            auStack_f8._40_8_ = auStack_f8._32_8_;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2d0,*(long *)(p_Var19 + 1),
                       (long)&(p_Var19[1]._M_parent)->_M_color + *(long *)(p_Var19 + 1));
            warn = (string *)local_518;
            local_518 = (undefined1  [8])local_508;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
            err = (string *)local_2b0;
            anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                      ((ParseResult *)local_5e0,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_350,&local_2d0,local_588,warn,
                       (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0);
            if (local_518 != (undefined1  [8])local_508) {
              operator_delete((void *)local_518,(ulong)(local_508._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            p_Var20 = (_Base_ptr)local_5a8._24_8_;
            if (local_5e0._0_4_ == TypeMismatch) {
              local_2f0._0_8_ = local_2e0;
              ::std::__cxx11::string::_M_construct<char*>
                        (local_2f0,*(long *)(p_Var19 + 1),
                         (long)&(p_Var19[1]._M_parent)->_M_color + *(long *)(p_Var19 + 1));
              warn = (string *)local_518;
              local_518 = (undefined1  [8])local_508;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
              args = local_588;
              err = (string *)local_548;
              (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                        ((ParseResult *)local_5b8,(_anonymous_namespace_ *)local_350,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2f0,(string *)local_588,(Property *)warn,(string *)local_548,
                         target);
              if (local_518 != (undefined1  [8])local_508) {
                operator_delete((void *)local_518,(ulong)(local_508._0_8_ + 1));
              }
              if ((long *)local_2f0._0_8_ != local_2e0) {
                operator_delete((void *)local_2f0._0_8_,local_2e0[0] + 1);
              }
              if (local_5b8._0_4_ == Success) {
                iVar10 = 3;
                p_Var20 = (_Base_ptr)local_5a8._24_8_;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_518);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_518,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_518,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_518,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_518,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_518,"():",3);
                poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_518,0x110b);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                local_580._M_dataplus._M_p._0_7_ = SUB87(&local_580.field_2,0);
                local_580._M_dataplus._M_p._7_1_ = (undefined1)((ulong)&local_580.field_2 >> 0x38);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_580,"Faied to parse inputs:varname: {}","");
                fmt::format<std::__cxx11::string>
                          (&local_600,(fmt *)&local_580,(string *)(local_5b8 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_518,local_600._M_dataplus._M_p,
                                     local_600._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_600._M_dataplus._M_p != &local_600.field_2) {
                  operator_delete(local_600._M_dataplus._M_p,
                                  local_600.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT17(local_580._M_dataplus._M_p._7_1_,local_580._M_dataplus._M_p._0_7_)
                    != &local_580.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT17(local_580._M_dataplus._M_p._7_1_,
                                           local_580._M_dataplus._M_p._0_7_),
                                  CONCAT17(local_580.field_2._M_local_buf[7],
                                           local_580.field_2._M_allocated_capacity._0_7_) + 1);
                }
                p_Var20 = (_Base_ptr)local_5a8._24_8_;
                if (target != (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar16 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)&local_580,
                                               (ulong)(target->_metas).interpolation);
                  psVar2 = (size_type *)(plVar16 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar16 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar2) {
                    local_600.field_2._M_allocated_capacity = *psVar2;
                    local_600.field_2._8_8_ = plVar16[3];
                    local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
                  }
                  else {
                    local_600.field_2._M_allocated_capacity = *psVar2;
                    local_600._M_dataplus._M_p = (pointer)*plVar16;
                  }
                  local_600._M_string_length = plVar16[1];
                  *plVar16 = (long)psVar2;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)target,(string *)&local_600);
                  p_Var20 = (_Base_ptr)local_5a8._24_8_;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_600._M_dataplus._M_p != &local_600.field_2) {
                    operator_delete(local_600._M_dataplus._M_p,
                                    local_600.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT17(local_580._M_dataplus._M_p._7_1_,local_580._M_dataplus._M_p._0_7_)
                      != &local_580.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT17(local_580._M_dataplus._M_p._7_1_,
                                             local_580._M_dataplus._M_p._0_7_),
                                    CONCAT17(local_580.field_2._M_local_buf[7],
                                             local_580.field_2._M_allocated_capacity._0_7_) + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_518);
                ::std::ios_base::~ios_base(local_4a8);
                iVar10 = 1;
              }
              if ((undefined1 *)local_5b8._8_8_ != local_5a8 + 8) {
                operator_delete((void *)local_5b8._8_8_,local_5a8._8_8_ + 1);
              }
            }
            else {
              iVar10 = 0;
              if (local_5e0._0_4_ == Success) {
                bVar7 = ConvertTokenAttributeToStringAttribute
                                  ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                                   local_2b0,
                                   (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_548);
                iVar10 = 3;
                if (!bVar7) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_518);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_518,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_518,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_518,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_518,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_518,"():",3)
                  ;
                  poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_518,0x10f9)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_518,
                             "Failed to convert inputs:varname token type to string type.",0x3b);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_518,"\n",1);
                  if (target != (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar16 = (long *)::std::__cxx11::string::_M_append
                                                ((char *)&local_600,
                                                 (ulong)(target->_metas).interpolation);
                    pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (plVar16 + 2);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        *plVar16 == pbVar18) {
                      local_5a8._0_8_ = (pbVar18->_M_dataplus)._M_p;
                      local_5a8._8_8_ = plVar16[3];
                      local_5b8._0_8_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_5a8;
                    }
                    else {
                      local_5a8._0_8_ = (pbVar18->_M_dataplus)._M_p;
                      local_5b8._0_8_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           *plVar16;
                    }
                    local_5b8._8_8_ = plVar16[1];
                    *plVar16 = (long)pbVar18;
                    plVar16[1] = 0;
                    *(undefined1 *)(plVar16 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)target,(string *)local_5b8);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_5b8._0_8_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_5a8) {
                      operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_600._M_dataplus._M_p != &local_600.field_2) {
                      operator_delete(local_600._M_dataplus._M_p,
                                      local_600.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_518);
                  ::std::ios_base::~ios_base(local_4a8);
                  iVar10 = 1;
                }
              }
            }
            if (local_5d8._M_p != local_5d0 + 8) {
              operator_delete(local_5d8._M_p,local_5d0._8_8_ + 1);
            }
            if (local_a0[0x18] == '\x01') {
              nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
              destruct_value((storage_t<tinyusdz::Animatable<tinyusdz::Token>_> *)local_80);
            }
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_a0);
            AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
            if (iVar10 != 0) goto LAB_0023c614;
          }
        }
        local_388._24_8_ = local_360;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_388 + 0x18),*(long *)(p_Var19 + 1),
                   (long)&(p_Var19[1]._M_parent)->_M_color + *(long *)(p_Var19 + 1));
        local_580._M_dataplus._M_p._0_7_ = SUB87(&local_580.field_2,0);
        local_580._M_dataplus._M_p._7_1_ = (undefined1)((ulong)&local_580.field_2 >> 0x38);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"outputs:result","");
        uVar6 = local_368;
        pbStack_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_508 + 8);
        local_508._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_508._8_8_ = local_508._8_8_ & 0xffffffffffffff00;
        uVar21 = CONCAT17(local_580._M_string_length._7_1_,(undefined7)local_580._M_string_length);
        __n_00 = local_368;
        if (uVar21 < local_368) {
          __n_00 = uVar21;
        }
        if (__n_00 == 0) {
          if (local_368 == uVar21) goto LAB_0023b22a;
LAB_0023b262:
          local_518._0_4_ = 1;
        }
        else {
          iVar10 = bcmp((void *)local_388._24_8_,
                        (void *)CONCAT17(local_580._M_dataplus._M_p._7_1_,
                                         local_580._M_dataplus._M_p._0_7_),__n_00);
          if ((uVar6 != uVar21) || (iVar10 != 0)) goto LAB_0023b262;
LAB_0023b22a:
          cVar14 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_350,&local_580);
          if (cVar14._M_node == (_Base_ptr)(local_350 + 8)) {
            if (*(uint *)((long)&p_Var19[0x17]._M_parent + 4) < 2) {
              bVar7 = Attribute::is_connection(&local_588->_attrib);
              if (bVar7) {
                local_518._0_4_ = 5;
                warn = (string *)0x38;
                ::std::__cxx11::string::_M_replace
                          ((ulong)&pbStack_510,0,(char *)local_508._0_8_,0x5d620d);
              }
              else {
                if (*(int *)((long)&p_Var19[0x17]._M_parent + 4) != 0) goto LAB_0023be69;
                Attribute::type_name_abi_cxx11_((string *)local_2b0,&local_588->_attrib);
                bVar7 = tinyusdz::value::IsRoleType((string *)local_2b0);
                local_5e0 = (undefined1  [8])local_5d0;
                local_5d8._M_p = (pointer)0x6;
                local_5d0._0_7_ = 0x3474616f6c66;
                if (((_Base_ptr)local_2b0._8_8_ == (_Base_ptr)0x6) &&
                   ((short)*(int *)(local_2b0._0_8_ + 4) == 0x3474 &&
                    *(int *)local_2b0._0_8_ == 0x616f6c66)) {
                  (local_560->result)._authored = true;
LAB_0023c737:
                  AttrMetas::operator=(local_550,(AttrMetas *)(p_Var19 + 7));
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_350,&local_580);
                  local_518 = (undefined1  [8])((ulong)local_518 & 0xffffffff00000000);
                }
                else if (bVar7) {
                  uVar11 = tinyusdz::value::GetUnderlyingTypeId((string *)local_2b0);
                  if (uVar11 == 0x2b) {
                    (local_560->result)._authored = true;
                    ::std::__cxx11::string::_M_assign((string *)local_4a8._272_8_);
                    goto LAB_0023c737;
                  }
                  local_518._0_4_ = 3;
                  local_5b8._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5a8;
                  local_5a8._24_8_ = p_Var20;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_5b8,
                             "Attribute type mismatch. {} expects type `{}` but defined as type `{}`(and its underlying types)."
                             ,"");
                  local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
                  local_600._M_string_length = 6;
                  local_600.field_2._M_allocated_capacity._0_7_ = 0x3474616f6c66;
                  warn = (string *)local_2b0;
                  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            ((string *)local_5e0,(fmt *)local_5b8,&local_580,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_600,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2b0,err);
                  ::std::__cxx11::string::operator=((string *)&pbStack_510,(string *)local_5e0);
                  if (local_5e0 != (undefined1  [8])local_5d0) {
                    operator_delete((void *)local_5e0,(ulong)(local_5d0._0_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_600._M_dataplus._M_p != &local_600.field_2) {
                    operator_delete(local_600._M_dataplus._M_p,
                                    local_600.field_2._M_allocated_capacity + 1);
                  }
                  p_Var20 = (_Base_ptr)local_5a8._24_8_;
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_5b8._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8
                     ) goto LAB_0023c719;
                }
                else {
                  local_518._0_4_ = 3;
                  local_600._M_dataplus._M_p = (pointer)0x46;
                  local_5b8._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5a8;
                  local_5a8._24_8_ = p_Var20;
                  pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ::std::__cxx11::string::_M_create((ulong *)local_5b8,(ulong)&local_600);
                  _Var3._M_p = local_600._M_dataplus._M_p;
                  local_5a8._0_8_ = local_600._M_dataplus._M_p;
                  local_5b8._0_8_ = pbVar18;
                  memcpy(pbVar18,
                         "Property type mismatch. {} expects type `{}` but defined as type `{}`.",
                         0x46);
                  local_5b8._8_8_ = _Var3._M_p;
                  _Var3._M_p[(long)&pbVar18->_M_dataplus] = '\0';
                  local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
                  local_600._M_string_length = 6;
                  local_600.field_2._M_allocated_capacity._0_7_ = 0x3474616f6c66;
                  warn = (string *)local_2b0;
                  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            ((string *)local_5e0,(fmt *)local_5b8,&local_580,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_600,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2b0,err);
                  ::std::__cxx11::string::operator=((string *)&pbStack_510,(string *)local_5e0);
                  if (local_5e0 != (undefined1  [8])local_5d0) {
                    operator_delete((void *)local_5e0,(ulong)(local_5d0._0_8_ + 1));
                  }
                  p_Var20 = (_Base_ptr)local_5a8._24_8_;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_600._M_dataplus._M_p != &local_600.field_2) {
                    operator_delete(local_600._M_dataplus._M_p,
                                    local_600.field_2._M_allocated_capacity + 1);
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_5b8._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8
                     ) {
LAB_0023c719:
                    operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0._0_8_ != &aStack_2a0) {
                  operator_delete((void *)local_2b0._0_8_,
                                  (ulong)(aStack_2a0._M_allocated_capacity + 1));
                }
              }
            }
            else {
LAB_0023be69:
              warn = (string *)&DAT_00000041;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&pbStack_510,0,(char *)local_508._0_8_,0x5d6246);
              local_518._0_4_ = 6;
            }
          }
          else {
            local_518._0_4_ = 2;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT17(local_580._M_dataplus._M_p._7_1_,local_580._M_dataplus._M_p._0_7_) !=
            &local_580.field_2) {
          operator_delete((undefined1 *)
                          CONCAT17(local_580._M_dataplus._M_p._7_1_,local_580._M_dataplus._M_p._0_7_
                                  ),
                          CONCAT17(local_580.field_2._M_local_buf[7],
                                   local_580.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((undefined1 *)local_388._24_8_ != local_360) {
          operator_delete((void *)local_388._24_8_,local_360._0_8_ + 1);
        }
        iVar10 = 0;
        if (((ulong)local_518 & 0xfffffffd) == 0) {
          iVar10 = 3;
LAB_0023b8f6:
          bVar7 = false;
        }
        else {
          bVar7 = true;
          if (local_518._0_4_ != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x1111);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
            local_5b8._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5b8,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_5e0,(fmt *)local_5b8,(string *)0x5e0dce,
                       (char (*) [15])&pbStack_510,warn);
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_5e0,(long)local_5d8._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            if (local_5e0 != (undefined1  [8])local_5d0) {
              operator_delete((void *)local_5e0,(ulong)(local_5d0._0_8_ + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8) {
              operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
            }
            if (target != (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar15 = (long *)::std::__cxx11::string::_M_append
                                          (local_5b8,(ulong)(target->_metas).interpolation);
              plVar16 = plVar15 + 2;
              if ((long *)*plVar15 == plVar16) {
                local_5d0._0_8_ = *plVar16;
                local_5d0._8_8_ = plVar15[3];
                local_5e0 = (undefined1  [8])local_5d0;
              }
              else {
                local_5d0._0_8_ = *plVar16;
                local_5e0 = (undefined1  [8])*plVar15;
              }
              local_5d8._M_p = (pointer)plVar15[1];
              *plVar15 = (long)plVar16;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)target,(string *)local_5e0);
              if (local_5e0 != (undefined1  [8])local_5d0) {
                operator_delete((void *)local_5e0,(ulong)(local_5d0._0_8_ + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_5b8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8) {
                operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)&_Stack_240);
            iVar10 = 1;
            goto LAB_0023b8f6;
          }
        }
        if (pbStack_510 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_508 + 8)) {
          operator_delete(pbStack_510,local_508._8_8_ + 1);
        }
        if (!bVar7) goto LAB_0023c614;
        cVar14 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_350,(key_type *)p_Var20);
        if (cVar14._M_node == (_Base_ptr)(local_350 + 8)) {
          pmVar17 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                  *)local_388._0_8_,(key_type *)p_Var20);
          ::std::__cxx11::string::_M_assign((string *)pmVar17);
          (pmVar17->_attrib)._varying_authored = (bool)p_Var19[3].field_0x4;
          (pmVar17->_attrib)._variability = p_Var19[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar17->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar17->_attrib)._var,(any *)&p_Var19[4]._M_parent);
          (pmVar17->_attrib)._var._blocked = SUB41(p_Var19[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&(pmVar17->_attrib)._var._ts,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var19[5]._M_parent);
          (pmVar17->_attrib)._var._ts._dirty = SUB41(p_Var19[6]._M_color,0);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar17->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var19[6]._M_parent);
          AttrMetas::operator=(&(pmVar17->_attrib)._metas,(AttrMetas *)(p_Var19 + 7));
          *(_Base_ptr *)&pmVar17->_listOpQual = p_Var19[0x17]._M_parent;
          (pmVar17->_rel).type = *(Type *)&p_Var19[0x17]._M_left;
          Path::operator=(&(pmVar17->_rel).targetPath,(Path *)&p_Var19[0x17]._M_right);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar17->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var19[0x1e]._M_parent);
          (pmVar17->_rel).listOpQual = p_Var19[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar17->_rel)._metas,(AttrMetas *)&p_Var19[0x1f]._M_parent);
          (pmVar17->_rel)._varying_authored = *(bool *)&p_Var19[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar17->_prop_value_type_name);
          pmVar17->_has_custom = *(bool *)&p_Var19[0x30]._M_right;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_350,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var20);
        }
        cVar14 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_350,(key_type *)p_Var20);
        if (cVar14._M_node == (_Base_ptr)(local_350 + 8)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar12 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x1113);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_518,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var20);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,(char *)local_518,(long)pbStack_510);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          if (local_518 != (undefined1  [8])local_508) {
            operator_delete((void *)local_518,(ulong)(local_508._0_8_ + 1));
          }
          if (local_540 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar13 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                (local_5e0,(ulong)(target->_metas).interpolation);
            pcVar1 = (char *)(puVar13 + 2);
            if ((char *)*puVar13 == pcVar1) {
              local_508._0_8_ = *(undefined8 *)pcVar1;
              local_508._8_8_ = puVar13[3];
              local_518 = (undefined1  [8])local_508;
            }
            else {
              local_508._0_8_ = *(undefined8 *)pcVar1;
              local_518 = (undefined1  [8])*puVar13;
            }
            pbStack_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          puVar13[1];
            *puVar13 = pcVar1;
            puVar13[1] = 0;
            *(undefined1 *)(puVar13 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_540,(string *)local_518);
            if (local_518 != (undefined1  [8])local_508) {
              operator_delete((void *)local_518,(ulong)(local_508._0_8_ + 1));
            }
            if (local_5e0 != (undefined1  [8])local_5d0) {
              operator_delete((void *)local_5e0,(ulong)(local_5d0._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)&_Stack_240);
        }
      }
      else {
LAB_0023c614:
        if ((iVar10 != 3) && (iVar10 != 0)) {
          bVar7 = false;
          goto LAB_0023c79a;
        }
      }
      p_Var19 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var19);
    } while (p_Var19 != (_Base_ptr)local_388._16_8_);
    bVar7 = true;
  }
LAB_0023c79a:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_350,(_Link_type)local_350._16_8_);
  return bVar7;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_float4>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_float4 *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_float4,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_float4, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float4, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}